

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_31::HttpClientAdapter::ResponseImpl::send
          (ResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  PromiseNode **ppPVar1;
  byte bVar2;
  IdsByNameMap *pIVar3;
  PromiseNode *pPVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  PromiseFulfiller<kj::HttpClient::Response> *pPVar6;
  char *pcVar7;
  size_t sVar8;
  HttpHeaderTable *pHVar9;
  ArrayDisposer *pAVar10;
  RemoveConst<kj::HttpHeaders::Header> *pRVar11;
  AsyncInputStream *pAVar12;
  TransformPromiseNodeBase *this_00;
  ResponseImpl *pRVar13;
  _func_int **pp_Var14;
  int __flags_00;
  byte bVar16;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  undefined4 in_register_00000034;
  ResponseImpl *pRVar17;
  StringPtr *__dest;
  undefined4 in_register_00000084;
  void *pvVar18;
  void *__arg;
  __fn *in_R9;
  undefined4 uVar19;
  undefined4 uVar20;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar21;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>_>
  OVar22;
  Own<kj::HttpHeaders> headersCopy;
  String statusTextCopy;
  RemoveConst<kj::HttpHeaders::Header> *local_128;
  Header *pHStack_120;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl> local_118;
  String local_108;
  Own<kj::_::PromiseNode> local_e8;
  HttpHeaders local_d8;
  OneWayPipe local_78;
  Maybe<unsigned_long> local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  size_t sVar15;
  
  pvVar18 = (void *)CONCAT44(in_register_00000084,__flags);
  pRVar17 = (ResponseImpl *)CONCAT44(in_register_00000034,__fd);
  sVar15 = __n;
  __arg = pvVar18;
  heapString(&local_108,(long)pvVar18 - 1);
  __flags_00 = (int)sVar15;
  __child_stack = extraout_RDX;
  if ((long)pvVar18 - 1U != 0) {
    __dest = (StringPtr *)local_108.content.size_;
    if ((StringPtr *)local_108.content.size_ != (StringPtr *)0x0) {
      __dest = (StringPtr *)local_108.content.ptr;
    }
    memcpy(__dest,(void *)__n,(long)pvVar18 - 1U);
    __child_stack = extraout_RDX_00;
  }
  HttpHeaders::clone(&local_d8,in_R9,__child_stack,__flags_00,__arg);
  heap<kj::HttpHeaders>((kj *)&local_128,&local_d8);
  HttpHeaders::~HttpHeaders(&local_d8);
  bVar2 = *(byte *)&(headersCopy.ptr)->table;
  bVar16 = bVar2;
  if (*(int *)((long)&((Own<kj::_::PromiseNode> *)&pRVar17->super_Refcounted)->ptr + 4) != 1) {
    aVar5 = local_58.ptr.field_1;
    if (((bVar2 & 1) == 0) ||
       (aVar5 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
                ((headersCopy.ptr)->indexedHeaders).ptr,
       (StringPtr *)aVar5.value != (StringPtr *)0x0)) {
      local_58.ptr.field_1 = aVar5;
      local_58.ptr.isSet = (bool)bVar2;
      newOneWayPipe(&local_78,&local_58);
      ppPVar1 = &((Own<kj::_::PromiseNode> *)&pRVar17->super_Refcounted)->ptr;
      *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
      local_118.disposer = &(pRVar17->super_Refcounted).super_Disposer;
      local_118.ptr = pRVar17;
      OVar22 = heap<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>
                         ((kj *)&local_d8,(Own<kj::_::PromiseNode> *)&pRVar17->task,&local_118);
      pHVar9 = local_d8.table;
      if (local_118.ptr != (ResponseImpl *)0x0) {
        (*(code *)((Disposer *)(local_118.disposer)->_vptr_Disposer)->_vptr_Disposer)
                  (local_118.disposer,
                   (((Vector<kj::StringPtr> *)&(local_118.ptr)->super_Response)->builder).ptr[-1].
                   content.ptr +
                   (long)&((Vector<kj::StringPtr> *)&(local_118.ptr)->super_Response)->builder,
                   OVar22.ptr);
      }
      local_d8.unindexedHeaders.builder.pos =
           (RemoveConst<kj::HttpHeaders::Header> *)operator_new(0x30);
      pAVar12 = local_78.in.ptr;
      ((local_d8.unindexedHeaders.builder.pos)->name).content.ptr = (char *)&PTR_read_00445e70;
      local_78.in.ptr = (AsyncInputStream *)0x0;
      ((local_d8.unindexedHeaders.builder.pos)->name).content.size_ =
           CONCAT44(local_78.in.disposer._4_4_,local_78.in.disposer._0_4_);
      ((local_d8.unindexedHeaders.builder.pos)->value).content.ptr = (char *)pAVar12;
      *(undefined1 *)&((local_d8.unindexedHeaders.builder.pos)->value).content.size_ = 1;
      local_d8.unindexedHeaders.builder.pos[1].name.content.ptr = (char *)pHVar9;
      local_d8.unindexedHeaders.builder.pos[1].name.content.size_ =
           (size_t)local_d8.indexedHeaders.ptr;
      pPVar6 = (pRVar17->fulfiller).ptr;
      local_d8.table = (HttpHeaderTable *)CONCAT44(local_d8.table._4_4_,(int)__buf);
      local_d8.indexedHeaders.ptr = (StringPtr *)0x36d124;
      if ((StringPtr *)local_108.content.size_ != (StringPtr *)0x0) {
        local_d8.indexedHeaders.ptr = (StringPtr *)local_108.content.ptr;
      }
      local_d8.indexedHeaders.size_ =
           (long)&((ArrayPtr<const_char> *)local_108.content.size_)->ptr +
           (ulong)((StringPtr *)local_108.content.size_ == (StringPtr *)0x0);
      local_d8.indexedHeaders.disposer = (ArrayDisposer *)pHStack_120;
      local_d8.unindexedHeaders.builder.ptr = (Header *)operator_new(0x40);
      ((local_d8.unindexedHeaders.builder.ptr)->name).content.size_ = (size_t)local_128;
      ((local_d8.unindexedHeaders.builder.ptr)->value).content.ptr = (char *)pHStack_120;
      pHStack_120 = (Header *)0x0;
      ((local_d8.unindexedHeaders.builder.ptr)->value).content.size_ = (size_t)local_108.content.ptr
      ;
      local_d8.unindexedHeaders.builder.ptr[1].name.content.ptr = (char *)local_108.content.size_;
      local_d8.unindexedHeaders.builder.ptr[1].name.content.size_ =
           (size_t)local_108.content.disposer;
      local_108.content.ptr = (char *)0x0;
      local_108.content.size_ = 0;
      local_d8.unindexedHeaders.builder.ptr[1].value.content.ptr =
           (char *)&_::
                    HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>
                    ::instance;
      local_d8.unindexedHeaders.builder.ptr[1].value.content.size_ =
           (size_t)local_d8.unindexedHeaders.builder.pos;
      ((local_d8.unindexedHeaders.builder.ptr)->name).content.ptr =
           (char *)&PTR_disposeImpl_00446190;
      (**pPVar6->_vptr_PromiseFulfiller)(pPVar6);
      pRVar11 = local_d8.unindexedHeaders.builder.pos;
      if (local_d8.unindexedHeaders.builder.pos != (RemoveConst<kj::HttpHeaders::Header> *)0x0) {
        local_d8.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
        (**(_func_int **)((local_d8.unindexedHeaders.builder.ptr)->name).content.ptr)
                  (local_d8.unindexedHeaders.builder.ptr,
                   *(_func_int **)((long)(pRVar11->name).content.ptr + -0x10) +
                   (long)&(pRVar11->name).content);
      }
      pAVar12 = local_78.in.ptr;
      *(undefined4 *)&(this->super_Response)._vptr_Response = local_78.out.disposer._0_4_;
      *(undefined4 *)((long)&(this->super_Response)._vptr_Response + 4) =
           local_78.out.disposer._4_4_;
      *(undefined4 *)&(this->super_Refcounted).super_Disposer._vptr_Disposer =
           local_78.out.ptr._0_4_;
      *(undefined4 *)((long)&(this->super_Refcounted).super_Disposer._vptr_Disposer + 4) =
           local_78.out.ptr._4_4_;
      local_78.out.ptr = (AsyncOutputStream *)0x0;
      if (local_78.in.ptr != (AsyncInputStream *)0x0) {
        local_78.in.ptr = (AsyncInputStream *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(local_78.in.disposer._4_4_,local_78.in.disposer._0_4_))
                  ((undefined8 *)CONCAT44(local_78.in.disposer._4_4_,local_78.in.disposer._0_4_),
                   pAVar12->_vptr_AsyncInputStream[-2] + (long)&pAVar12->_vptr_AsyncInputStream);
      }
      goto LAB_002e03e9;
    }
    bVar16 = 1;
  }
  local_d8.indexedHeaders.ptr = (StringPtr *)CONCAT44(local_d8.indexedHeaders.ptr._4_4_,(int)__buf);
  local_d8.indexedHeaders.size_ = (size_t)local_108.content.ptr;
  local_d8.indexedHeaders.disposer = (ArrayDisposer *)local_108.content.size_;
  local_d8.unindexedHeaders.builder.ptr = (Header *)local_108.content.disposer;
  local_108.content.ptr = (char *)0x0;
  local_108.content.size_ = 0;
  local_d8.unindexedHeaders.builder.pos = local_128;
  local_d8.unindexedHeaders.builder.endPtr = pHStack_120;
  pHStack_120 = (Header *)0x0;
  if ((bVar16 & 1) != 0) {
    local_d8.ownedStrings.builder.ptr = (Array<char> *)((headersCopy.ptr)->indexedHeaders).ptr;
  }
  local_d8.table = (HttpHeaderTable *)pRVar17;
  local_d8.unindexedHeaders.builder.disposer._0_1_ = bVar2;
  this_00 = (TransformPromiseNodeBase *)operator_new(0x70);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&pRVar17->task,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4311:26),_kj::_::PropagateException>
             ::anon_class_72_5_009bee8d_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00445bf8;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_d8.table;
  *(undefined4 *)&this_00[1].dependency.disposer = local_d8.indexedHeaders.ptr._0_4_;
  this_00[1].dependency.ptr = (PromiseNode *)local_d8.indexedHeaders.size_;
  this_00[1].continuationTracePtr = local_d8.indexedHeaders.disposer;
  local_d8.indexedHeaders.size_ = 0;
  local_d8.indexedHeaders.disposer = (ArrayDisposer *)0x0;
  this_00[2].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)local_d8.unindexedHeaders.builder.ptr;
  this_00[2].dependency.disposer = (Disposer *)local_d8.unindexedHeaders.builder.pos;
  this_00[2].dependency.ptr = (PromiseNode *)local_d8.unindexedHeaders.builder.endPtr;
  local_d8.unindexedHeaders.builder.endPtr = (Header *)0x0;
  *(byte *)&this_00[2].continuationTracePtr = (byte)local_d8.unindexedHeaders.builder.disposer;
  if ((byte)local_d8.unindexedHeaders.builder.disposer == 1) {
    this_00[3].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_d8.ownedStrings.builder.ptr
    ;
  }
  local_e8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1},kj::_::PropagateException>>
        ::instance;
  local_e8.ptr = (PromiseNode *)this_00;
  pRVar13 = (ResponseImpl *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            ((TransformPromiseNodeBase *)pRVar13,&local_e8,_::IdentityFunc<void>::operator());
  (((Vector<kj::StringPtr> *)&pRVar13->super_Response)->builder).ptr =
       (StringPtr *)&PTR_onReady_00445d68;
  local_118.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Exception&&)#1}>>
        ::instance;
  local_118.ptr = pRVar13;
  OVar21 = heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_78,(Own<kj::_::PromiseNode> *)&local_118);
  pRVar13 = local_118.ptr;
  uVar19 = local_78.in.ptr._0_4_;
  uVar20 = local_78.in.ptr._4_4_;
  if (local_118.ptr != (ResponseImpl *)0x0) {
    local_118.ptr = (ResponseImpl *)0x0;
    local_48 = local_78.in.disposer._0_4_;
    uStack_44 = local_78.in.disposer._4_4_;
    uStack_40 = local_78.in.ptr._0_4_;
    uStack_3c = local_78.in.ptr._4_4_;
    (*(code *)((Disposer *)(local_118.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_118.disposer,
               (((Vector<kj::StringPtr> *)&pRVar13->super_Response)->builder).ptr[-1].content.ptr +
               (long)&((Vector<kj::StringPtr> *)&pRVar13->super_Response)->builder,OVar21.ptr);
    local_78.in.disposer._0_4_ = local_48;
    local_78.in.disposer._4_4_ = uStack_44;
    uVar19 = uStack_40;
    uVar20 = uStack_3c;
  }
  pIVar3 = (IdsByNameMap *)(pRVar17->task).super_PromiseBase.node.disposer;
  pPVar4 = (pRVar17->task).super_PromiseBase.node.ptr;
  *(undefined4 *)&(pRVar17->task).super_PromiseBase.node.disposer = local_78.in.disposer._0_4_;
  *(undefined4 *)((long)&(pRVar17->task).super_PromiseBase.node.disposer + 4) =
       local_78.in.disposer._4_4_;
  *(undefined4 *)&(pRVar17->task).super_PromiseBase.node.ptr = uVar19;
  *(undefined4 *)((long)&(pRVar17->task).super_PromiseBase.node.ptr + 4) = uVar20;
  if (pPVar4 != (PromiseNode *)0x0) {
    (*(code *)*(pIVar3->map)._M_h._M_buckets)
              (pIVar3,pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode);
  }
  pPVar4 = local_e8.ptr;
  if ((TransformPromiseNodeBase *)local_e8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_e8.ptr = (PromiseNode *)0x0;
    (**(local_e8.disposer)->_vptr_Disposer)
              (local_e8.disposer,
               ((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  if (local_d8.unindexedHeaders.builder.endPtr != (Header *)0x0) {
    local_d8.unindexedHeaders.builder.endPtr = (Header *)0x0;
    (**(_func_int **)((local_d8.unindexedHeaders.builder.pos)->name).content.ptr)();
  }
  pAVar10 = local_d8.indexedHeaders.disposer;
  sVar8 = local_d8.indexedHeaders.size_;
  if ((char *)local_d8.indexedHeaders.size_ != (char *)0x0) {
    local_d8.indexedHeaders.size_ = 0;
    local_d8.indexedHeaders.disposer = (ArrayDisposer *)0x0;
    (**(_func_int **)((local_d8.unindexedHeaders.builder.ptr)->name).content.ptr)
              (local_d8.unindexedHeaders.builder.ptr,sVar8,1,pAVar10,pAVar10,0);
  }
  pp_Var14 = (_func_int **)operator_new(8);
  *pp_Var14 = (_func_int *)&PTR_write_00445df0;
  (this->super_Response)._vptr_Response =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::NullOutputStream>::instance;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var14;
LAB_002e03e9:
  if (pHStack_120 != (Header *)0x0) {
    pHStack_120 = (Header *)0x0;
    (**(_func_int **)(local_128->name).content.ptr)();
  }
  sVar8 = local_108.content.size_;
  pcVar7 = local_108.content.ptr;
  if (local_108.content.ptr != (char *)0x0) {
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    (**(_func_int **)
       (((StringPtr *)&(local_108.content.disposer)->_vptr_ArrayDisposer)->content).ptr)
              (local_108.content.disposer,pcVar7,1,sVar8,sVar8,0);
  }
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (method == kj::HttpMethod::HEAD || expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::heap<NullInputStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<NullOutputStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        auto wrapper = kj::heap<DelayedEofInputStream>(
            kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }